

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void JX9_DIR_Const(jx9_value *pVal,void *pUserData)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  undefined8 *puVar4;
  uint nLen;
  jx9_vm *pVm;
  char *zString;
  long lVar5;
  
  if (*(int *)((long)pUserData + 0x3f0) == 0) {
    puVar4 = (undefined8 *)0x0;
  }
  else {
    puVar4 = (undefined8 *)
             ((ulong)(uint)((*(int *)((long)pUserData + 0x3f0) + -1) *
                           *(int *)((long)pUserData + 0x3f8)) + *(long *)((long)pUserData + 1000));
  }
  if (puVar4 == (undefined8 *)0x0) {
    jx9_value_string(pVal,":MEMORY:",8);
    return;
  }
  lVar3 = (long)*(int *)(puVar4 + 1);
  if (lVar3 != 0) {
    zString = (char *)*puVar4;
    lVar1 = 0;
    do {
      lVar5 = lVar1;
      if (zString + lVar5 + lVar3 + -1 <= zString) break;
      lVar1 = lVar5 + -1;
    } while (zString[lVar5 + lVar3 + -1] != '/');
    if ((1 - lVar3 != lVar5) || (zString[lVar5 + lVar3 + -1] == '/')) {
      uVar2 = *(int *)(puVar4 + 1) + -1 + (int)lVar5;
      nLen = 1;
      if (1 < uVar2) {
        nLen = uVar2;
      }
      if (uVar2 == 0) {
        zString = "/";
      }
      jx9_value_string(pVal,zString,nLen);
      return;
    }
  }
  jx9_value_string(pVal,".",1);
  return;
}

Assistant:

static void JX9_DIR_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	SyString *pFile;
	/* Peek the top entry */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile == 0 ){
		/* Expand the magic word: ":MEMORY:" */
		jx9_value_string(pVal, ":MEMORY:", (int)sizeof(":MEMORY:")-1);
	}else{
		if( pFile->nByte > 0 ){
			const char *zDir;
			int nLen;
			zDir = jx9ExtractDirName(pFile->zString, (int)pFile->nByte, &nLen);
			jx9_value_string(pVal, zDir, nLen);
		}else{
			/* Expand '.' as the current directory*/
			jx9_value_string(pVal, ".", (int)sizeof(char));
		}
	}
}